

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceSumLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducesum(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceSumLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducesum(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducesum(this);
    this_00 = (ReduceSumLayerParams *)operator_new(0x30);
    ReduceSumLayerParams::ReduceSumLayerParams(this_00);
    (this->layer_).reducesum_ = this_00;
  }
  return (ReduceSumLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceSumLayerParams* NeuralNetworkLayer::mutable_reducesum() {
  if (!has_reducesum()) {
    clear_layer();
    set_has_reducesum();
    layer_.reducesum_ = new ::CoreML::Specification::ReduceSumLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceSum)
  return layer_.reducesum_;
}